

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBVertexStreamsTest::getShaderBody
          (XFBVertexStreamsTest *this,GLuint param_1,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  char *pcVar1;
  bool *__s;
  
  std::__cxx11::string::_M_replace
            ((ulong)out_calculations,0,(char *)out_calculations->_M_string_length,0x1af8059);
  pcVar1 = 
  "    goku   = uni_goku;\n    gohan  = uni_gohan;\n    goten  = uni_goten;\n    EmitStreamVertex(0);\n    EndStreamPrimitive(0);\n    picolo = uni_picolo;\n    vegeta = uni_vegeta;\n    EmitStreamVertex(1);\n    EndStreamPrimitive(1);\n    bulma  = uni_bulma;\n    EmitStreamVertex(2);\n    EndStreamPrimitive(2);\n"
  ;
  if (stage != GEOMETRY) {
    pcVar1 = ::glcts::fixed_sample_locations_values + 1;
  }
  __s = (bool *)"    fs_out = gohan + goku + goten + picolo + vegeta + bulma;\n";
  if (stage != FRAGMENT) {
    __s = (bool *)pcVar1;
  }
  pcVar1 = (char *)out_assignments->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)out_assignments,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void XFBVertexStreamsTest::getShaderBody(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
										 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	// the shader declares the output variables with different "stream" qualifier, to make the data can export to
	// each stream, we must call the function EmitStreamVertex() and EndStreamPrimitive() to make each vertex emitted
	// by the GS is assigned to specific stream.
	static const GLchar* gs = "    goku   = uni_goku;\n"
							  "    gohan  = uni_gohan;\n"
							  "    goten  = uni_goten;\n"
							  "    EmitStreamVertex(0);\n"
							  "    EndStreamPrimitive(0);\n"
							  "    picolo = uni_picolo;\n"
							  "    vegeta = uni_vegeta;\n"
							  "    EmitStreamVertex(1);\n"
							  "    EndStreamPrimitive(1);\n"
							  "    bulma  = uni_bulma;\n"
							  "    EmitStreamVertex(2);\n"
							  "    EndStreamPrimitive(2);\n";

	static const GLchar* fs = "    fs_out = gohan + goku + goten + picolo + vegeta + bulma;\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;
}